

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pod_circularbuffer.h
# Opt level: O0

ssize_t __thiscall
PodCircularBuffer<char>::read(PodCircularBuffer<char> *this,int __fd,void *__buf,size_t __nbytes)

{
  int iVar1;
  undefined4 in_register_00000034;
  void *__dest;
  int local_4c;
  uint local_48;
  int local_44;
  int leftcount_2;
  int c;
  int leftcount_1;
  int leftcount;
  int count_local;
  char *buf_local;
  PodCircularBuffer<char> *this_local;
  
  __dest = (void *)CONCAT44(in_register_00000034,__fd);
  this_local._4_4_ = (uint)__buf;
  if ((int)this_local._4_4_ < 1) {
    this_local._4_4_ = 0;
  }
  else if ((this->m_bEmpty & 1U) == 0) {
    this->m_bFull = false;
    if (this->m_nReadPos == this->m_nWritePos) {
      iVar1 = this->m_nBufSize - this->m_nReadPos;
      if ((int)this_local._4_4_ < iVar1) {
        memcpy(__dest,this->m_pBuf + this->m_nReadPos,(long)(int)this_local._4_4_);
        this->m_nReadPos = this_local._4_4_ + this->m_nReadPos;
        this->m_bEmpty = this->m_nReadPos == this->m_nWritePos;
      }
      else {
        memcpy(__dest,this->m_pBuf + this->m_nReadPos,(long)iVar1);
        if ((int)(this_local._4_4_ - iVar1) < this->m_nWritePos) {
          local_44 = this_local._4_4_ - iVar1;
        }
        else {
          local_44 = this->m_nWritePos;
        }
        this->m_nReadPos = local_44;
        memcpy((void *)((long)__dest + (long)iVar1),this->m_pBuf,(long)this->m_nReadPos);
        this->m_bEmpty = this->m_nReadPos == this->m_nWritePos;
        this_local._4_4_ = iVar1 + this->m_nReadPos;
      }
    }
    else if (this->m_nReadPos < this->m_nWritePos) {
      local_48 = this->m_nWritePos - this->m_nReadPos;
      if ((int)this_local._4_4_ < (int)local_48) {
        local_48 = this_local._4_4_;
      }
      memcpy(__dest,this->m_pBuf + this->m_nReadPos,(long)(int)local_48);
      this->m_nReadPos = local_48 + this->m_nReadPos;
      this->m_bEmpty = this->m_nReadPos == this->m_nWritePos;
      if (this->m_nBufSize < this->m_nReadPos) {
        __assert_fail("m_nReadPos <= m_nBufSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/wqvbjhc[P]libuv_tcp/pod_circularbuffer.h"
                      ,0xbd,"int PodCircularBuffer<char>::read(T *, int) [T = char]");
      }
      if (this->m_nBufSize < this->m_nWritePos) {
        __assert_fail("m_nWritePos <= m_nBufSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/wqvbjhc[P]libuv_tcp/pod_circularbuffer.h"
                      ,0xbe,"int PodCircularBuffer<char>::read(T *, int) [T = char]");
      }
      this_local._4_4_ = local_48;
    }
    else {
      iVar1 = this->m_nBufSize - this->m_nReadPos;
      if ((int)this_local._4_4_ < iVar1) {
        memcpy(__dest,this->m_pBuf + this->m_nReadPos,(long)(int)this_local._4_4_);
        this->m_nReadPos = this_local._4_4_ + this->m_nReadPos;
        this->m_bEmpty = this->m_nReadPos == this->m_nWritePos;
        if (this->m_nBufSize < this->m_nReadPos) {
          __assert_fail("m_nReadPos <= m_nBufSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/wqvbjhc[P]libuv_tcp/pod_circularbuffer.h"
                        ,0xcc,"int PodCircularBuffer<char>::read(T *, int) [T = char]");
        }
        if (this->m_nBufSize < this->m_nWritePos) {
          __assert_fail("m_nWritePos <= m_nBufSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/wqvbjhc[P]libuv_tcp/pod_circularbuffer.h"
                        ,0xcd,"int PodCircularBuffer<char>::read(T *, int) [T = char]");
        }
      }
      else {
        memcpy(__dest,this->m_pBuf + this->m_nReadPos,(long)iVar1);
        if (this->m_nWritePos < (int)(this_local._4_4_ - iVar1)) {
          local_4c = this->m_nWritePos;
        }
        else {
          local_4c = this_local._4_4_ - iVar1;
        }
        this->m_nReadPos = local_4c;
        memcpy((void *)((long)__dest + (long)iVar1),this->m_pBuf,(long)this->m_nReadPos);
        this->m_bEmpty = this->m_nReadPos == this->m_nWritePos;
        if (this->m_nBufSize < this->m_nReadPos) {
          __assert_fail("m_nReadPos <= m_nBufSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/wqvbjhc[P]libuv_tcp/pod_circularbuffer.h"
                        ,0xd4,"int PodCircularBuffer<char>::read(T *, int) [T = char]");
        }
        if (this->m_nBufSize < this->m_nWritePos) {
          __assert_fail("m_nWritePos <= m_nBufSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/wqvbjhc[P]libuv_tcp/pod_circularbuffer.h"
                        ,0xd5,"int PodCircularBuffer<char>::read(T *, int) [T = char]");
        }
        this_local._4_4_ = iVar1 + this->m_nReadPos;
      }
    }
  }
  else {
    this_local._4_4_ = 0;
  }
  return (ulong)this_local._4_4_;
}

Assistant:

int read(T* buf, int count) {
        if(count <= 0) {
            return 0;
        }
        if(m_bEmpty) {// 缓冲区空，不能继续读取数据
            return 0;
        }
        m_bFull = false;
        if(m_nReadPos == m_nWritePos) { // 缓冲区满时
            /*                          == 内存模型 ==
             (data)          m_nReadPos                (data)
            |--------------------------------|--------------------------------------------|
              m_nWritePos         m_nBufSize
            */
            int leftcount = m_nBufSize - m_nReadPos;
            if(leftcount > count) {
                memcpy(buf, &m_pBuf[m_nReadPos], count * sizeof(T));
                m_nReadPos += count;
                m_bEmpty = (m_nReadPos == m_nWritePos);
                return count;
            } else {
                memcpy(buf, &m_pBuf[m_nReadPos], leftcount * sizeof(T));
                m_nReadPos = (m_nWritePos > count - leftcount) ? count - leftcount : m_nWritePos;
                memcpy(&buf[leftcount], m_pBuf, m_nReadPos * sizeof(T));
                m_bEmpty = (m_nReadPos == m_nWritePos);
                return leftcount + m_nReadPos;
            }
        } else if(m_nReadPos < m_nWritePos) { // 写指针在前(未读数据是连接的)
            /*                          == 内存模型 ==
             (read)                 (unread)                      (read)
            |-------------------|----------------------------|---------------------------|
               m_nReadPos                m_nWritePos                     m_nBufSize
            */
            int leftcount = m_nWritePos - m_nReadPos;
            int c = (leftcount > count) ? count : leftcount;
            memcpy(buf, &m_pBuf[m_nReadPos], c * sizeof(T));
            m_nReadPos += c;
            m_bEmpty = (m_nReadPos == m_nWritePos);
            assert(m_nReadPos <= m_nBufSize);
            assert(m_nWritePos <= m_nBufSize);
            return c;
        } else {      // 读指针在前(未读数据可能是不连接的)
            /*                          == 内存模型 ==
               (unread)                (read)                      (unread)
            |-------------------|----------------------------|---------------------------|
                m_nWritePos                  m_nReadPos                  m_nBufSize

            */
            int leftcount = m_nBufSize - m_nReadPos;
            if(leftcount > count) { // 未读缓冲区够大，直接读取数据
                memcpy(buf, &m_pBuf[m_nReadPos], count * sizeof(T));
                m_nReadPos += count;
                m_bEmpty = (m_nReadPos == m_nWritePos);
                assert(m_nReadPos <= m_nBufSize);
                assert(m_nWritePos <= m_nBufSize);
                return count;
            } else {   // 未读缓冲区不足，需回到缓冲区头开始读
                memcpy(buf, &m_pBuf[m_nReadPos], leftcount * sizeof(T));
                m_nReadPos = (m_nWritePos >= count - leftcount) ? count - leftcount : m_nWritePos;
                memcpy(&buf[leftcount], m_pBuf, m_nReadPos * sizeof(T));
                m_bEmpty = (m_nReadPos == m_nWritePos);
                assert(m_nReadPos <= m_nBufSize);
                assert(m_nWritePos <= m_nBufSize);
                return leftcount + m_nReadPos;
            }
        }
    }